

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O0

void __thiscall
jrtplib::RTPTCPTransmitter::RTPTCPTransmitter(RTPTCPTransmitter *this,RTPMemoryManager *mgr)

{
  RTPMemoryManager *mgr_local;
  RTPTCPTransmitter *this_local;
  
  RTPTransmitter::RTPTransmitter(&this->super_RTPTransmitter,mgr);
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPTCPTransmitter_001935d0;
  std::
  map<int,_jrtplib::RTPTCPTransmitter::SocketData,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
  ::map(&this->m_destSockets);
  std::vector<int,_std::allocator<int>_>::vector(&this->m_tmpSocks);
  std::vector<signed_char,_std::allocator<signed_char>_>::vector(&this->m_tmpFlags);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_localHostname);
  std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::list
            (&this->m_rawpacketlist);
  RTPAbortDescriptors::RTPAbortDescriptors(&this->m_abortDesc);
  this->m_created = false;
  this->m_init = false;
  return;
}

Assistant:

RTPTCPTransmitter::RTPTCPTransmitter(RTPMemoryManager *mgr) : RTPTransmitter(mgr)
{
	m_created = false;
	m_init = false;
}